

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

SESSION_SEND_TRANSFER_RESULT
session_send_transfer
          (LINK_ENDPOINT_HANDLE link_endpoint,TRANSFER_HANDLE transfer,PAYLOAD *payloads,
          size_t payload_count,delivery_number *delivery_id,ON_SEND_COMPLETE on_send_complete,
          void *callback_context)

{
  int iVar1;
  AMQP_VALUE performative;
  PAYLOAD *pPVar2;
  bool more_value;
  ON_SEND_COMPLETE local_108;
  uint local_dc;
  ulong local_d8;
  ulong local_d0;
  uint32_t transfer_frame_payload_len;
  size_t payload_len;
  _Bool more;
  PAYLOAD *transfer_frame_payloads;
  AMQP_VALUE multi_transfer_amqp_value;
  ulong uStack_98;
  uint32_t temp_current_payload_pos;
  size_t temp_current_payload_index;
  uint32_t byte_counter;
  uint32_t current_transfer_frame_payload_size;
  uint32_t transfer_frame_payload_count;
  uint32_t current_payload_pos;
  size_t current_payload_index;
  size_t encoded_size;
  AMQP_VALUE pAStack_68;
  uint32_t available_frame_size;
  AMQP_VALUE transfer_value;
  size_t i;
  size_t payload_size;
  SESSION_INSTANCE *session_instance;
  LINK_ENDPOINT_INSTANCE *link_endpoint_instance;
  ON_SEND_COMPLETE p_Stack_38;
  SESSION_SEND_TRANSFER_RESULT result;
  ON_SEND_COMPLETE on_send_complete_local;
  delivery_number *delivery_id_local;
  size_t payload_count_local;
  PAYLOAD *payloads_local;
  TRANSFER_HANDLE transfer_local;
  LINK_ENDPOINT_HANDLE link_endpoint_local;
  
  if ((link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) || (transfer == (TRANSFER_HANDLE)0x0)) {
    link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_ERROR;
  }
  else {
    payload_size = (size_t)link_endpoint->session;
    if (((SESSION_HANDLE)payload_size)->session_state == SESSION_STATE_MAPPED) {
      transfer_value = (AMQP_VALUE)0x0;
      for (i = 0; ((transfer_value < payload_count &&
                   (payloads[(long)transfer_value].length < 0x100000000)) &&
                  (i <= i + payloads[(long)transfer_value].length)); i = pPVar2->length + i) {
        pPVar2 = payloads + (long)transfer_value;
        transfer_value = (AMQP_VALUE)((long)&transfer_value->type + 1);
      }
      if ((transfer_value < payload_count) || (0xffffffff < i)) {
        link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_ERROR;
      }
      else if (((SESSION_HANDLE)payload_size)->remote_incoming_window == 0) {
        link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_BUSY;
      }
      else {
        *delivery_id = ((SESSION_HANDLE)payload_size)->next_outgoing_id;
        session_instance = (SESSION_INSTANCE *)link_endpoint;
        p_Stack_38 = on_send_complete;
        on_send_complete_local = (ON_SEND_COMPLETE)delivery_id;
        delivery_id_local = (delivery_number *)payload_count;
        payload_count_local = (size_t)payloads;
        payloads_local = (PAYLOAD *)transfer;
        transfer_local = (TRANSFER_HANDLE)link_endpoint;
        iVar1 = transfer_set_handle(transfer,link_endpoint->output_handle);
        if (((iVar1 == 0) &&
            (iVar1 = transfer_set_delivery_id
                               ((TRANSFER_HANDLE)payloads_local,
                                *(delivery_number *)on_send_complete_local), iVar1 == 0)) &&
           (iVar1 = transfer_set_more((TRANSFER_HANDLE)payloads_local,false), iVar1 == 0)) {
          pAStack_68 = amqpvalue_create_transfer((TRANSFER_HANDLE)payloads_local);
          if (pAStack_68 == (AMQP_VALUE)0x0) {
            link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_ERROR;
          }
          else {
            iVar1 = connection_get_remote_max_frame_size
                              (*(CONNECTION_HANDLE *)(payload_size + 0x18),
                               (uint32_t *)((long)&encoded_size + 4));
            if ((iVar1 == 0) &&
               (iVar1 = amqpvalue_get_encoded_size(pAStack_68,&current_payload_index), iVar1 == 0))
            {
              i = 0;
              for (transfer_value = (AMQP_VALUE)0x0; transfer_value < delivery_id_local;
                  transfer_value = (AMQP_VALUE)((long)&transfer_value->type + 1)) {
                i = *(long *)(payload_count_local + (long)transfer_value * 0x10 + 8) + i;
              }
              encoded_size._4_4_ = (encoded_size._4_4_ - (int)current_payload_index) - 8;
              if (encoded_size._4_4_ < i) {
                _transfer_frame_payload_count = 0;
                current_transfer_frame_payload_size = 0;
                for (; i != 0; i = i - temp_current_payload_index._4_4_) {
                  temp_current_payload_index._4_4_ = (uint)i;
                  uStack_98 = _transfer_frame_payload_count;
                  multi_transfer_amqp_value._4_4_ = current_transfer_frame_payload_size;
                  if (encoded_size._4_4_ < temp_current_payload_index._4_4_) {
                    temp_current_payload_index._4_4_ = encoded_size._4_4_;
                  }
                  more_value = encoded_size._4_4_ < i;
                  iVar1 = transfer_set_more((TRANSFER_HANDLE)payloads_local,more_value);
                  if ((iVar1 != 0) ||
                     (performative = amqpvalue_create_transfer((TRANSFER_HANDLE)payloads_local),
                     performative == (AMQP_VALUE)0x0)) break;
                  temp_current_payload_index._0_4_ = temp_current_payload_index._4_4_;
                  while ((uint)temp_current_payload_index != 0) {
                    if (*(long *)(payload_count_local + uStack_98 * 0x10 + 8) -
                        (ulong)multi_transfer_amqp_value._4_4_ <
                        (ulong)(uint)temp_current_payload_index) {
                      temp_current_payload_index._0_4_ =
                           (uint)temp_current_payload_index -
                           ((int)*(undefined8 *)(payload_count_local + uStack_98 * 0x10 + 8) -
                           multi_transfer_amqp_value._4_4_);
                      uStack_98 = uStack_98 + 1;
                      multi_transfer_amqp_value._4_4_ = 0;
                    }
                    else {
                      multi_transfer_amqp_value._4_4_ =
                           (uint)temp_current_payload_index + multi_transfer_amqp_value._4_4_;
                      temp_current_payload_index._0_4_ = 0;
                    }
                  }
                  if (uStack_98 < _transfer_frame_payload_count) {
                    local_d0 = 0xffffffffffffffff;
                  }
                  else {
                    local_d0 = uStack_98 - _transfer_frame_payload_count;
                  }
                  if (local_d0 < 0xfffffffffffffffe) {
                    local_d8 = local_d0 + 1;
                  }
                  else {
                    local_d8 = 0xffffffffffffffff;
                  }
                  if (local_d8 < 0xffffffff) {
                    local_dc = (uint)local_d8;
                  }
                  else {
                    local_dc = 0xffffffff;
                  }
                  if ((local_dc == 0xffffffff) ||
                     (pPVar2 = (PAYLOAD *)calloc(1,(ulong)local_dc << 4), pPVar2 == (PAYLOAD *)0x0))
                  {
                    amqpvalue_destroy(performative);
                    break;
                  }
                  temp_current_payload_index._0_4_ = temp_current_payload_index._4_4_;
                  for (byte_counter = 0;
                      (uint)temp_current_payload_index != 0 && byte_counter < local_dc;
                      byte_counter = byte_counter + 1) {
                    if ((ulong)(uint)temp_current_payload_index <
                        *(long *)(payload_count_local + _transfer_frame_payload_count * 0x10 + 8) -
                        (ulong)current_transfer_frame_payload_size) {
                      pPVar2[byte_counter].bytes =
                           (uchar *)(*(long *)(payload_count_local +
                                              _transfer_frame_payload_count * 0x10) +
                                    (ulong)current_transfer_frame_payload_size);
                      pPVar2[byte_counter].length = (ulong)(uint)temp_current_payload_index;
                      current_transfer_frame_payload_size =
                           (uint)temp_current_payload_index + current_transfer_frame_payload_size;
                      temp_current_payload_index._0_4_ = 0;
                    }
                    else {
                      pPVar2[byte_counter].bytes =
                           (uchar *)(*(long *)(payload_count_local +
                                              _transfer_frame_payload_count * 0x10) +
                                    (ulong)current_transfer_frame_payload_size);
                      pPVar2[byte_counter].length =
                           *(long *)(payload_count_local + _transfer_frame_payload_count * 0x10 + 8)
                           - (ulong)current_transfer_frame_payload_size;
                      temp_current_payload_index._0_4_ =
                           (uint)temp_current_payload_index -
                           ((int)*(undefined8 *)
                                  (payload_count_local + _transfer_frame_payload_count * 0x10 + 8) -
                           current_transfer_frame_payload_size);
                      _transfer_frame_payload_count = _transfer_frame_payload_count + 1;
                      current_transfer_frame_payload_size = 0;
                    }
                  }
                  if (more_value) {
                    local_108 = (ON_SEND_COMPLETE)0x0;
                  }
                  else {
                    local_108 = p_Stack_38;
                  }
                  iVar1 = connection_encode_frame
                                    (*(ENDPOINT_HANDLE *)(payload_size + 0x20),performative,pPVar2,
                                     (ulong)byte_counter,local_108,callback_context);
                  if (iVar1 != 0) {
                    free(pPVar2);
                    amqpvalue_destroy(performative);
                    break;
                  }
                  free(pPVar2);
                  amqpvalue_destroy(performative);
                }
                if (i == 0) {
                  *(int *)(payload_size + 0x48) = *(int *)(payload_size + 0x48) + 1;
                  *(int *)(payload_size + 0x60) = *(int *)(payload_size + 0x60) + -1;
                  *(int *)(payload_size + 0x58) = *(int *)(payload_size + 0x58) + -1;
                  link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_OK;
                }
                else {
                  link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_ERROR;
                }
              }
              else {
                iVar1 = connection_encode_frame
                                  (*(ENDPOINT_HANDLE *)(payload_size + 0x20),pAStack_68,
                                   (PAYLOAD *)payload_count_local,(size_t)delivery_id_local,
                                   p_Stack_38,callback_context);
                if (iVar1 == 0) {
                  *(int *)(payload_size + 0x48) = *(int *)(payload_size + 0x48) + 1;
                  *(int *)(payload_size + 0x60) = *(int *)(payload_size + 0x60) + -1;
                  *(int *)(payload_size + 0x58) = *(int *)(payload_size + 0x58) + -1;
                  link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_OK;
                }
                else {
                  link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_ERROR;
                }
              }
            }
            else {
              link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_ERROR;
            }
            amqpvalue_destroy(pAStack_68);
          }
        }
        else {
          link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_ERROR;
        }
      }
    }
    else {
      link_endpoint_instance._4_4_ = SESSION_SEND_TRANSFER_ERROR;
    }
  }
  return link_endpoint_instance._4_4_;
}

Assistant:

SESSION_SEND_TRANSFER_RESULT session_send_transfer(LINK_ENDPOINT_HANDLE link_endpoint, TRANSFER_HANDLE transfer, PAYLOAD* payloads, size_t payload_count, delivery_number* delivery_id, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    SESSION_SEND_TRANSFER_RESULT result;

    /* Codes_S_R_S_SESSION_01_054: [If link_endpoint or transfer is NULL, session_send_transfer shall fail and return a non-zero value.] */
    if ((link_endpoint == NULL) ||
        (transfer == NULL))
    {
        result = SESSION_SEND_TRANSFER_ERROR;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)link_endpoint_instance->session;

        /* Codes_S_R_S_SESSION_01_059: [When session_send_transfer is called while the session is not in the MAPPED state, session_send_transfer shall fail and return a non-zero value.] */
        if (session_instance->session_state != SESSION_STATE_MAPPED)
        {
            result = SESSION_SEND_TRANSFER_ERROR;
        }
        else
        {
            size_t payload_size = 0;
            size_t i;

            for (i = 0; i < payload_count; i++)
            {
                if ((payloads[i].length > UINT32_MAX) ||
                    (payload_size + payloads[i].length < payload_size))
                {
                    break;
                }

                payload_size += payloads[i].length;
            }

            if ((i < payload_count) ||
                (payload_size > UINT32_MAX))
            {
                result = SESSION_SEND_TRANSFER_ERROR;
            }
            else
            {
                if (session_instance->remote_incoming_window == 0)
                {
                    result = SESSION_SEND_TRANSFER_BUSY;
                }
                else
                {
                    /* Codes_S_R_S_SESSION_01_012: [The session endpoint assigns each outgoing transfer frame an implicit transfer-id from a session scoped sequence.] */
                    /* Codes_S_R_S_SESSION_01_027: [sending a transfer Upon sending a transfer, the sending endpoint will increment its next-outgoing-id] */
                    *delivery_id = session_instance->next_outgoing_id;
                    if ((transfer_set_handle(transfer, link_endpoint_instance->output_handle) != 0) ||
                        (transfer_set_delivery_id(transfer, *delivery_id) != 0) ||
                        (transfer_set_more(transfer, false) != 0))
                    {
                        /* Codes_S_R_S_SESSION_01_058: [When any other error occurs, session_send_transfer shall fail and return a non-zero value.] */
                        result = SESSION_SEND_TRANSFER_ERROR;
                    }
                    else
                    {
                        AMQP_VALUE transfer_value;

                        transfer_value = amqpvalue_create_transfer(transfer);
                        if (transfer_value == NULL)
                        {
                            /* Codes_S_R_S_SESSION_01_058: [When any other error occurs, session_send_transfer shall fail and return a non-zero value.] */
                            result = SESSION_SEND_TRANSFER_ERROR;
                        }
                        else
                        {
                            uint32_t available_frame_size;
                            size_t encoded_size;

                            if ((connection_get_remote_max_frame_size(session_instance->connection, &available_frame_size) != 0) ||
                                (amqpvalue_get_encoded_size(transfer_value, &encoded_size) != 0))
                            {
                                result = SESSION_SEND_TRANSFER_ERROR;
                            }
                            else
                            {
                                payload_size = 0;

                                for (i = 0; i < payload_count; i++)
                                {
                                    payload_size += payloads[i].length;
                                }

                                available_frame_size -= (uint32_t)encoded_size;
                                available_frame_size -= 8;

                                if (available_frame_size >= payload_size)
                                {
                                    /* Codes_S_R_S_SESSION_01_055: [The encoding of the frame shall be done by calling connection_encode_frame and passing as arguments: the connection handle associated with the session, the transfer performative and the payload chunks passed to session_send_transfer.] */
                                    if (connection_encode_frame(session_instance->endpoint, transfer_value, payloads, payload_count, on_send_complete, callback_context) != 0)
                                    {
                                        /* Codes_S_R_S_SESSION_01_056: [If connection_encode_frame fails then session_send_transfer shall fail and return a non-zero value.] */
                                        result = SESSION_SEND_TRANSFER_ERROR;
                                    }
                                    else
                                    {
                                        /* Codes_S_R_S_SESSION_01_018: [is incremented after each successive transfer according to RFC-1982 [RFC1982] serial number arithmetic.] */
                                        session_instance->next_outgoing_id++;
                                        session_instance->remote_incoming_window--;
                                        session_instance->outgoing_window--;

                                        /* Codes_S_R_S_SESSION_01_053: [On success, session_send_transfer shall return 0.] */
                                        result = SESSION_SEND_TRANSFER_OK;
                                    }
                                }
                                else
                                {
                                    size_t current_payload_index = 0;
                                    uint32_t current_payload_pos = 0;

                                    /* break it down into different deliveries */
                                    while (payload_size > 0)
                                    {
                                        uint32_t transfer_frame_payload_count = 0;
                                        uint32_t current_transfer_frame_payload_size = (uint32_t)payload_size;
                                        uint32_t byte_counter;
                                        size_t temp_current_payload_index = current_payload_index;
                                        uint32_t temp_current_payload_pos = current_payload_pos;
                                        AMQP_VALUE multi_transfer_amqp_value;
                                        PAYLOAD* transfer_frame_payloads;
                                        bool more;

                                        if (current_transfer_frame_payload_size > available_frame_size)
                                        {
                                            current_transfer_frame_payload_size = available_frame_size;
                                        }

                                        if (available_frame_size >= payload_size)
                                        {
                                            more = false;
                                        }
                                        else
                                        {
                                            more = true;
                                        }

                                        if (transfer_set_more(transfer, more) != 0)
                                        {
                                            break;
                                        }

                                        multi_transfer_amqp_value = amqpvalue_create_transfer(transfer);
                                        if (multi_transfer_amqp_value == NULL)
                                        {
                                            break;
                                        }

                                        byte_counter = current_transfer_frame_payload_size;
                                        while (byte_counter > 0)
                                        {
                                            if (payloads[temp_current_payload_index].length - temp_current_payload_pos >= byte_counter)
                                            {
                                                /* more data than we need */
                                                temp_current_payload_pos += byte_counter;
                                                byte_counter = 0;
                                            }
                                            else
                                            {
                                                byte_counter -= (uint32_t)payloads[temp_current_payload_index].length - temp_current_payload_pos;
                                                temp_current_payload_index++;
                                                temp_current_payload_pos = 0;
                                            }
                                        }

                                        //transfer_frame_payload_len = (uint32_t)(temp_current_payload_index - current_payload_index + 1); // use safe int
                                        size_t payload_len = safe_subtract_size_t(temp_current_payload_index, current_payload_index);
                                        payload_len = safe_add_size_t(payload_len, 1);
                                        uint32_t transfer_frame_payload_len = payload_len < UINT32_MAX ? (uint32_t)payload_len : UINT32_MAX;

                                        if (transfer_frame_payload_len == UINT32_MAX ||
                                           (transfer_frame_payloads = (PAYLOAD*)calloc(1, (transfer_frame_payload_len * sizeof(PAYLOAD)))) == NULL)
                                        {
                                            amqpvalue_destroy(multi_transfer_amqp_value);
                                            break;
                                        }

                                        /* copy data */
                                        byte_counter = current_transfer_frame_payload_size;
                                        transfer_frame_payload_count = 0;

                                        while (byte_counter > 0 && transfer_frame_payload_count < transfer_frame_payload_len)
                                        {
                                            if (payloads[current_payload_index].length - current_payload_pos > byte_counter)
                                            {
                                                /* more data than we need */
                                                transfer_frame_payloads[transfer_frame_payload_count].bytes = payloads[current_payload_index].bytes + current_payload_pos;
                                                transfer_frame_payloads[transfer_frame_payload_count].length = byte_counter;
                                                current_payload_pos += byte_counter;
                                                byte_counter = 0;
                                            }
                                            else
                                            {
                                                /* copy entire payload and move to the next */
                                                transfer_frame_payloads[transfer_frame_payload_count].bytes = payloads[current_payload_index].bytes + current_payload_pos;
                                                transfer_frame_payloads[transfer_frame_payload_count].length = payloads[current_payload_index].length - current_payload_pos;
                                                byte_counter -= (uint32_t)payloads[current_payload_index].length - current_payload_pos;
                                                current_payload_index++;
                                                current_payload_pos = 0;
                                            }

                                            transfer_frame_payload_count++;
                                        }

                                        if (connection_encode_frame(session_instance->endpoint, multi_transfer_amqp_value, transfer_frame_payloads, transfer_frame_payload_count,
                                            /* only fire the send complete calllback on the last frame of the multi frame transfer */
                                            more ? NULL : on_send_complete,
                                            callback_context) != 0)
                                        {
                                            free(transfer_frame_payloads);
                                            amqpvalue_destroy(multi_transfer_amqp_value);
                                            break;
                                        }

                                        free(transfer_frame_payloads);
                                        amqpvalue_destroy(multi_transfer_amqp_value);
                                        payload_size -= current_transfer_frame_payload_size;
                                    }

                                    if (payload_size > 0)
                                    {
                                        result = SESSION_SEND_TRANSFER_ERROR;
                                    }
                                    else
                                    {
                                        /* Codes_S_R_S_SESSION_01_018: [is incremented after each successive transfer according to RFC-1982 [RFC1982] serial number arithmetic.] */
                                        session_instance->next_outgoing_id++;
                                        session_instance->remote_incoming_window--;
                                        session_instance->outgoing_window--;

                                        result = SESSION_SEND_TRANSFER_OK;
                                    }
                                }
                            }

                            amqpvalue_destroy(transfer_value);
                        }
                    }
                }
            }
        }
    }

    return result;
}